

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayView.h
# Opt level: O0

ArrayView<const_Position> __thiscall
Corrade::Containers::
arrayCast<Corrade::Utility::Implementation::resourceLookup(unsigned_int,unsigned_int_const*,unsigned_char_const*,Corrade::Containers::BasicStringView<char_const>)::Position_const,unsigned_int_const>
          (Containers *this,ArrayView<const_unsigned_int> view)

{
  size_t sVar1;
  long lVar2;
  ostream *output;
  Debug *pDVar3;
  Position *data;
  Flags local_59;
  Error local_58;
  ulong local_30;
  size_t size;
  ArrayView<const_unsigned_int> view_local;
  
  view_local._data = view._data;
  size = (size_t)this;
  sVar1 = ArrayView<const_unsigned_int>::size((ArrayView<const_unsigned_int> *)&size);
  local_30 = (sVar1 << 2) >> 3;
  lVar2 = local_30 << 3;
  sVar1 = ArrayView<const_unsigned_int>::size((ArrayView<const_unsigned_int> *)&size);
  if (lVar2 != sVar1 << 2) {
    output = Utility::Error::defaultOutput();
    EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_59);
    Utility::Error::Error(&local_58,output,local_59);
    pDVar3 = Utility::Debug::operator<<
                       (&local_58.super_Debug,"Containers::arrayCast(): can\'t reinterpret");
    sVar1 = ArrayView<const_unsigned_int>::size((ArrayView<const_unsigned_int> *)&size);
    pDVar3 = Utility::Debug::operator<<(pDVar3,sVar1);
    pDVar3 = Utility::Debug::operator<<(pDVar3,4);
    pDVar3 = Utility::Debug::operator<<(pDVar3,Utility::Debug::nospace);
    pDVar3 = Utility::Debug::operator<<(pDVar3,"-byte items into a");
    pDVar3 = Utility::Debug::operator<<(pDVar3,8);
    pDVar3 = Utility::Debug::operator<<(pDVar3,Utility::Debug::nospace);
    Utility::Debug::operator<<(pDVar3,"-byte type");
    Utility::Error::~Error(&local_58);
    abort();
  }
  data = (Position *)ArrayView<const_unsigned_int>::begin((ArrayView<const_unsigned_int> *)&size);
  ArrayView<const_Position>::ArrayView((ArrayView<const_Position> *)&view_local._size,data,local_30)
  ;
  return stack0xffffffffffffffe8;
}

Assistant:

ArrayView<U> arrayCast(ArrayView<T> view) {
    static_assert(std::is_standard_layout<T>::value, "the source type is not standard layout");
    static_assert(std::is_standard_layout<U>::value, "the target type is not standard layout");
    const std::size_t size = view.size()*sizeof(T)/sizeof(U);
    /* Unlike slice() etc, this is usually not called in tight loops and should
       be as checked as possible, so it's not a debug assert */
    CORRADE_ASSERT(size*sizeof(U) == view.size()*sizeof(T),
        "Containers::arrayCast(): can't reinterpret" << view.size() << sizeof(T) << Utility::Debug::nospace << "-byte items into a" << sizeof(U) << Utility::Debug::nospace << "-byte type", {});
    return {reinterpret_cast<U*>(view.begin()), size};
}